

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Recycler.cpp
# Opt level: O2

bool Memory::Recycler::WBCheckIsRecyclerAddress(char *addr)

{
  Recycler *this;
  HeapBlock *pHVar1;
  Recycler **ppRVar2;
  AutoCriticalSection local_20;
  AutoCriticalSection lock;
  
  local_20.cs = &recyclerListLock;
  CCLock::Enter(&recyclerListLock.super_CCLock);
  ppRVar2 = &recyclerList;
  do {
    this = *ppRVar2;
    if (this == (Recycler *)0x0) break;
    pHVar1 = FindHeapBlock(this,(void *)((ulong)addr & 0xfffffffffffffff0));
    ppRVar2 = &this->next;
  } while (pHVar1 == (HeapBlock *)0x0);
  AutoCriticalSection::~AutoCriticalSection(&local_20);
  return this != (Recycler *)0x0;
}

Assistant:

bool
Recycler::WBCheckIsRecyclerAddress(char* addr)
{
    AutoCriticalSection lock(&recyclerListLock);
    Recycler* recycler = Recycler::recyclerList;
    while (recycler)
    {
        auto heapBlock = recycler->FindHeapBlock((void*)((UINT_PTR)addr&~HeapInfo::ObjectAlignmentMask));
        if (heapBlock)
        {
            return true;
        }
        recycler = recycler->next;
    }
    return false;
}